

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall CEditorImage::~CEditorImage(CEditorImage *this)

{
  IGraphics *pIVar1;
  long in_RDI;
  
  pIVar1 = CEditor::Graphics(*(CEditor **)(in_RDI + 0x18));
  (*(pIVar1->super_IInterface)._vptr_IInterface[0xf])(pIVar1,in_RDI + 0x20);
  if (*(long *)(in_RDI + 0x10) != 0) {
    mem_free((void *)0x1e9b4a);
    *(undefined8 *)(in_RDI + 0x10) = 0;
  }
  if (*(long *)(in_RDI + 0x1a8) != 0) {
    if (*(long **)(in_RDI + 0x1a8) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x1a8) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x1a8) = 0;
  }
  return;
}

Assistant:

CEditorImage::~CEditorImage()
{
	m_pEditor->Graphics()->UnloadTexture(&m_Texture);
	if(m_pData)
	{
		mem_free(m_pData);
		m_pData = 0;
	}
	if(m_pAutoMapper)
	{
		delete m_pAutoMapper;
		m_pAutoMapper = 0;
	}
}